

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetBytesDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  undefined1 uVar1;
  undefined1 uVar3;
  undefined2 uVar4;
  EnumValueDescriptor *pEVar2;
  undefined4 uVar5;
  AlphaNum *in_R8;
  string_view input;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined8 local_48;
  char *local_40;
  
  pEVar2 = (descriptor->field_20).default_value_enum_;
  if (pEVar2->all_names_ == (string *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"pb::ByteString.Empty","");
  }
  else {
    local_48 = 0x1b;
    local_40 = "pb::ByteString.FromBase64(\"";
    uVar1 = pEVar2->super_SymbolBaseN<0>;
    uVar3 = pEVar2->super_SymbolBaseN<1>;
    uVar4 = *(undefined2 *)&pEVar2->field_0x2;
    uVar5 = pEVar2->number_;
    input._M_len._4_4_ = uVar5;
    input._M_len._2_2_ = uVar4;
    input._M_len._1_1_ = uVar3;
    input._M_len._0_1_ = uVar1;
    input._M_str = "pb::ByteString.FromBase64(\"";
    StringToBase64_abi_cxx11_(&local_c8,(csharp *)pEVar2->all_names_,input);
    local_78.piece_._M_len = local_c8._M_string_length;
    local_78.piece_._M_str = local_c8._M_dataplus._M_p;
    local_a8.piece_._M_len = 2;
    local_a8.piece_._M_str = "\")";
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,&local_a8,in_R8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetBytesDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "pb::ByteString.Empty";
    return absl::StrCat("pb::ByteString.FromBase64(\"",
                        StringToBase64(descriptor->default_value_string()),
                        "\")");
}